

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O3

void __thiscall
VGMPlayer::DoRAMOfsPatches
          (VGMPlayer *this,UINT8 chipType,UINT8 chipID,UINT32 *dataOfs,UINT32 *dataLen)

{
  long lVar1;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,chipType) == 5) {
    lVar1 = 0x6998;
  }
  else {
    if (CONCAT31(in_register_00000031,chipType) != 0x10) {
      return;
    }
    lVar1 = 0x699a;
  }
  *dataOfs = *dataOfs |
             (uint)*(byte *)((long)&(this->super_PlayerBase)._vptr_PlayerBase +
                            (ulong)chipID + lVar1) << 0xc;
  return;
}

Assistant:

void VGMPlayer::DoRAMOfsPatches(UINT8 chipType, UINT8 chipID, UINT32& dataOfs, UINT32& dataLen)
{
	switch(chipType)
	{
	case 0x05:	// RF5C68
		dataOfs |= (_rf5cBank[0][chipID] << 12);	// add current memory bank to offset
		break;
	case 0x10:	// RF5C164
		dataOfs |= (_rf5cBank[1][chipID] << 12);	// add current memory bank to offset
		break;
	}
	
	return;
}